

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O3

void syms_dump_e(FILE *f,symtbl_t *t)

{
  sym_t *psVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  
  if (t->num_syms != 0) {
    fwrite(";-------------------------------------------------------------------------------\n",0x51
           ,1,(FILE *)f);
    if (t->num_syms != 0) {
      uVar5 = 0;
      do {
        psVar1 = t->syms[uVar5];
        pcVar3 = token_name(psVar1->type_id);
        pcVar4 = "YES";
        if (psVar1->function == 0) {
          pcVar4 = "";
        }
        fprintf((FILE *)f,"; %-31s %-9s %-5s %-6d\n",psVar1,pcVar3,pcVar4,(ulong)(uint)t->scope_id);
        uVar5 = uVar5 + 1;
      } while (uVar5 < t->num_syms);
    }
  }
  uVar2 = t->num_children;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      if (t->children[uVar5] != (symtbl_t *)0x0) {
        syms_dump_e(f,t->children[uVar5]);
        uVar2 = t->num_children;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar2);
  }
  return;
}

Assistant:

void syms_dump_e(FILE* f, symtbl_t* t)
{
    unsigned int i;
    if (t->num_syms)
        fprintf(f, ";-------------------------------------------------------------------------------\n");
    for (i = 0; i < t->num_syms; i++)
    {
        sym_t* s = t->syms[i];
        fprintf(f, "; %-31s %-9s %-5s %-6d\n", s->id, token_name(s->type_id), s->function ? "YES" : "", t->scope_id);
    }

    for (i = 0; i < t->num_children; i++)
    {
        if (t->children[i])
            syms_dump_e(f, t->children[i]);
    }
}